

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O3

void __thiscall TcpSocketTest::test2(TcpSocketTest *this)

{
  int iVar1;
  uint uVar2;
  uint32_t number;
  uint32_t new_number;
  Address server_addr;
  ServerSocket server;
  Socket sock;
  Socket sock3;
  Socket sock2;
  Socket sock4;
  undefined4 local_26c;
  undefined1 local_268 [4];
  char local_264 [16];
  undefined4 local_254;
  Address local_240 [3];
  Address local_1d0 [2];
  undefined4 local_188;
  Address local_160 [2];
  undefined4 local_118;
  Address local_f0 [3];
  Address local_80 [3];
  
  this->delay = true;
  JetHead::Socket::Socket((Socket *)local_1d0,true);
  JetHead::Socket::Socket((Socket *)local_f0,true);
  JetHead::Socket::Socket((Socket *)local_160,true);
  JetHead::Socket::Socket((Socket *)local_80,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_240,true);
  local_264[0] = '\x02';
  local_264[1] = '\0';
  local_264[2] = '\0';
  local_264[3] = '\0';
  local_264[4] = '\0';
  local_264[5] = '\0';
  local_264[6] = '\0';
  local_264[7] = '\0';
  local_254 = 0x10;
  iVar1 = JetHead::ServerSocket::bind(local_240);
  if (iVar1 < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1b2,"Bind Failed");
  }
  iVar1 = JetHead::ServerSocket::listen((int)local_240);
  if (iVar1 < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1b7,"Listen Failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress(local_240);
  JetHead::Socket::Address::setAddress(local_264);
  if (iVar1 < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1bd,"get local addr failed");
  }
  JetHead::Socket::setSelector((SocketListener *)local_240,(Selector *)&this->super_SocketListener);
  uVar2 = JetHead::Socket::connect(local_1d0);
  if ((int)uVar2 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1c5,"connect failed: %d.",(ulong)uVar2);
  }
  uVar2 = JetHead::Socket::connect(local_f0);
  if ((int)uVar2 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1c9,"connect failed: %d.",(ulong)uVar2);
  }
  uVar2 = JetHead::Socket::connect(local_f0);
  if (uVar2 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1cd,"connect should only work once: %d.",(ulong)uVar2);
  }
  uVar2 = JetHead::Socket::connect(local_80);
  if ((int)uVar2 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1d1,"connect failed: %d.",(ulong)uVar2);
  }
  local_26c = 1000;
  iVar1 = JetHead::Socket::write(local_80,(int)&local_26c);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x1db,"write failed");
  }
  JetHead::Socket::close();
  local_188 = 1;
  if (iVar1 < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1e5,"connect failed");
  }
  iVar1 = JetHead::Socket::write(local_1d0,(int)&local_26c);
  if (iVar1 < 0) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1ea,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_1d0,(int)local_268);
  if (0 < iVar1) {
    jh_log_print(3,"void TcpSocketTest::test2()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
                 ,0x1fa,"timeout failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  local_118 = 0;
  uVar2 = JetHead::Socket::connect(local_160);
  if ((int)uVar2 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x207,"connect failed: %d.",(ulong)uVar2);
  }
  local_26c = 0x3ea;
  JetHead::Socket::write(local_160,(int)&local_26c);
  JetHead::Socket::write(local_160,(int)&local_26c);
  this->delay = false;
  JetHead::Socket::setSelector((SocketListener *)local_240,(Selector *)0x0);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_240);
  JetHead::Socket::~Socket((Socket *)local_80);
  JetHead::Socket::~Socket((Socket *)local_160);
  JetHead::Socket::~Socket((Socket *)local_f0);
  JetHead::Socket::~Socket((Socket *)local_1d0);
  return;
}

Assistant:

void TcpSocketTest::test2()

{
        delay = true;
        Socket sock, sock2, sock3, sock4;
	ServerSocket server;
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		LOG_WARN_PERROR( "Bind Failed" );

	res = server.listen( 1 );

	if ( res < 0 )
		LOG_WARN_PERROR( "Listen Failed" );
	
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	

	server.setSelector( this, mSelector );
	res = sock.connect( server_addr );
	if (res < 0)
	  TestFailed("connect failed: %d.", res);

	res = sock2.connect( server_addr );
	if (res < 0)
	  TestFailed("connect failed: %d.", res);
	
	res = sock2.connect(server_addr);
	if (res != -1)
	  TestFailed("connect should only work once: %d.", res);

	res = sock4.connect(server_addr);
	if (res < 0)
	  TestFailed("connect failed: %d.", res);
	
	

	uint32_t number = 1000;
	uint32_t new_number;

	res = sock4.write( &number, 4 );
	
	if ( res < 0 )
	  TestFailed( "write failed" );
	
	//sock4.shutdown();
	sock2.close();

	
	
	sock.setReadTimeout(1);

	if ( res < 0 )
		LOG_WARN_PERROR( "connect failed" );

	res = sock.write( &number, 4 );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );


	// The goal was to test to make sure listen works
	// but it appears that tcp just waits it out, so this doesn't
	// work
	//	res = sock2.write( &number, 4 );
	//if ( res > 0 )
	//TestFailed("Server accepts too many connections: %d.", res);


	// the timeout is set smaller than the delay
	// therefore this fail.

	res = sock.read( &new_number, 4 );
	if ( res > 0 )
		LOG_WARN_PERROR( "timeout failed" );


	mTestState = 0;

	sock.close();
	
	
       	
	sock3.setReadTimeout(0);

	res = sock3.connect( server_addr );
	if (res < 0)
	  TestFailed("connect failed: %d.", res);
	number = 1002;
	res = sock3.write(&number, 4);
	//	cerr << res << endl;
	res = sock3.write(&number, 4);
	//cerr << res << endl;

	
	// The goal here was to test the timeour feature of
	// the socket, but since we can't sleep for a sufficent
	// legnth of time we are sol.
	//	res = sock3.read(&new_number, 4);
	//if ( res > 0 )
	//TestFailed("setReadTiemout ignored");



	
	delay = false;

	server.setSelector((SocketListener*)NULL, NULL);
}